

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QSizeF *s)

{
  long lVar1;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffffaf;
  Stream *size;
  QDebug *in_stack_ffffffffffffffc8;
  QDebugStateSaver *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RDX,in_stack_00000008);
  QtDebugUtils::formatQSize<QSizeF>(in_RSI,(QSizeF *)size);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffffaf);
  QDebug::QDebug(in_RSI,(QDebug *)size);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)size;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSizeF &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSizeF(";
    QtDebugUtils::formatQSize(dbg, s);
    dbg << ')';
    return dbg;
}